

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

ssize_t zt_cstr_any(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  sVar1 = strlen(s);
  if (sVar1 == 0) {
    lVar5 = 0;
    lVar4 = 0;
  }
  else {
    if (i < 0) {
      lVar3 = sVar1 - 1;
      if ((long)(i + sVar1) < (long)sVar1) {
        lVar3 = i + sVar1;
      }
    }
    else {
      lVar3 = sVar1 - 1;
      if (i < (long)sVar1) {
        lVar3 = i;
      }
    }
    if (j < 0) {
      lVar4 = sVar1 - 1;
      if ((long)(j + sVar1) < (long)sVar1) {
        lVar4 = j + sVar1;
      }
    }
    else {
      lVar4 = sVar1 - 1;
      if (j < (long)sVar1) {
        lVar4 = j;
      }
    }
    lVar5 = lVar4;
    if (lVar4 < lVar3) {
      lVar5 = lVar3;
    }
    if (lVar3 < lVar4) {
      lVar4 = lVar3;
    }
  }
  if (lVar4 <= lVar5) {
    do {
      if ((s[lVar4] != '\0') && (pcVar2 = strchr(set,(int)s[lVar4]), pcVar2 != (char *)0x0)) {
        return lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 + 1 != lVar4);
  }
  return -1;
}

Assistant:

ssize_t
zt_cstr_any(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(s);
    zt_assert(set);

    CONVERT(s, i, j);

    zt_assert(i >= 0 && i <= j);

    for (; i <= j; i++) {
        if (s[i] != '\0' && strchr(set, s[i])) {
            return i;
        }
    }

    return -1;
}